

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

uint32 readle32(void)

{
  ssize_t sVar1;
  ssize_t br;
  uint32 retval;
  
  br._4_4_ = 0;
  if ((io_failure == 0) && (sVar1 = read(logfd,(void *)((long)&br + 4),4), sVar1 != 4)) {
    IO_READ_FAIL((uint)(-1 < sVar1));
  }
  return br._4_4_;
}

Assistant:

static uint32 readle32(void)
{
    uint32 retval = 0;
    if (!io_failure) {
        const ssize_t br = read(logfd, &retval, sizeof (retval));
        if (br != ((ssize_t) sizeof (retval))) {
            IO_READ_FAIL(br >= 0);
        }
    }
    return swap32(retval);
}